

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O1

bool __thiscall
absl::numbers_internal::safe_strtou32_base
          (numbers_internal *this,string_view text,uint32_t *value,int base)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint *puVar4;
  numbers_internal *pnVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool local_1d;
  int local_1c;
  string_view local_18;
  
  puVar4 = (uint *)text.length_;
  local_18.length_ = (size_type)text.ptr_;
  local_1c = (int)value;
  *puVar4 = 0;
  local_18.ptr_ = (char *)this;
  bVar3 = anon_unknown_0::safe_parse_sign_and_base(&local_18,&local_1c,&local_1d);
  if ((bVar3) && (local_1d == false)) {
    if ((long)local_1c < 0) {
      __assert_fail("base >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/numbers.cc"
                    ,0x319,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType *) [IntType = unsigned int]"
                   );
    }
    bVar3 = (long)local_18.length_ < 1;
    if ((long)local_18.length_ < 1) {
      uVar8 = 0;
    }
    else {
      uVar1 = *(uint *)((anonymous_namespace)::LookupTables<unsigned_int>::kVmaxOverBase +
                       (long)local_1c * 4);
      pnVar5 = (numbers_internal *)(local_18.length_ + (long)local_18.ptr_);
      uVar6 = 0;
      do {
        uVar7 = (uint)(char)(anonymous_namespace)::kAsciiToInt[(byte)*local_18.ptr_];
        if ((int)uVar7 < local_1c) {
          if (uVar1 < uVar6) {
LAB_00234460:
            *puVar4 = 0xffffffff;
            goto LAB_0023446a;
          }
          uVar6 = uVar6 * local_1c;
          uVar8 = uVar7 + uVar6;
          if (CARRY4(uVar7,uVar6)) goto LAB_00234460;
          bVar2 = true;
        }
        else {
          *puVar4 = uVar6;
LAB_0023446a:
          bVar2 = false;
          uVar8 = uVar6;
        }
        if (!bVar2) {
          return bVar3;
        }
        local_18.ptr_ = (char *)((numbers_internal *)local_18.ptr_ + 1);
        bVar3 = local_18.ptr_ >= pnVar5;
        uVar6 = uVar8;
      } while (local_18.ptr_ < pnVar5);
    }
    *puVar4 = uVar8;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool safe_strtou32_base(absl::string_view text, uint32_t* value, int base) {
  return safe_uint_internal<uint32_t>(text, value, base);
}